

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_GetIterator(JSContext *ctx,JSValue obj,BOOL is_async)

{
  int iVar1;
  JSValueUnion JVar3;
  JSValue *pJVar4;
  ulong uVar5;
  uint uVar6;
  JSValue v;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue method;
  JSValueUnion JVar2;
  
  if (is_async == 0) {
    JVar7 = JS_GetPropertyInternal(ctx,obj,0xc6,obj,0);
    JVar2 = JVar7.u;
LAB_0013c37e:
    JVar8.tag = JVar7.tag;
    uVar6 = (uint)JVar7.tag;
    if (uVar6 != 6) {
      JVar8.u.ptr = JVar2.ptr;
      iVar1 = JS_IsFunction(ctx,JVar8);
      if (iVar1 == 0) {
        if ((0xfffffff4 < uVar6) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2))
        {
          JVar9.tag = JVar8.tag;
          JVar9.u.ptr = JVar2.ptr;
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
        JS_ThrowTypeError(ctx,"value is not iterable");
        JVar7 = (JSValue)(ZEXT816(6) << 0x40);
      }
      else {
        method.tag = JVar8.tag;
        method.u.ptr = JVar2.ptr;
        JVar7 = JS_GetIterator2(ctx,obj,method);
        if ((0xfffffff4 < uVar6) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2))
        {
          v.tag = JVar8.tag;
          v.u.ptr = JVar2.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
      }
    }
    return JVar7;
  }
  JVar7 = JS_GetPropertyInternal(ctx,obj,0xd1,obj,0);
  JVar2 = JVar7.u;
  if (1 < (int)JVar7.tag - 2U) goto LAB_0013c37e;
  JVar7 = JS_GetPropertyInternal(ctx,obj,0xc6,obj,0);
  if ((uint)JVar7.tag == 6) {
    return JVar7;
  }
  JVar8 = JS_GetIterator2(ctx,obj,JVar7);
  JVar2 = JVar8.u;
  if ((0xfffffff4 < (uint)JVar7.tag) &&
     (iVar1 = *JVar7.u.ptr, *(int *)JVar7.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar7);
  }
  uVar6 = (uint)JVar8.tag;
  if (uVar6 == 6) {
    return JVar8;
  }
  JVar7 = JS_GetPropertyInternal(ctx,JVar8,0x6a,JVar8,0);
  if ((int)JVar7.tag != 6) {
    JVar9 = JS_NewObjectProtoClass(ctx,ctx->class_proto[0x30],0x30);
    JVar3 = JVar9.u;
    if ((int)JVar9.tag == 6) {
      JS_FreeValue(ctx,JVar7);
      uVar5 = (ulong)JVar3.ptr & 0xffffffff00000000;
      goto LAB_0013c547;
    }
    pJVar4 = (JSValue *)js_mallocz(ctx,0x20);
    if (pJVar4 != (JSValue *)0x0) {
      if (0xfffffff4 < uVar6) {
        *(int *)JVar2.ptr = *JVar2.ptr + 1;
      }
      *pJVar4 = JVar8;
      pJVar4[1] = JVar7;
      if ((int)JVar9.tag == -1) {
        *(JSValue **)((long)JVar3.ptr + 0x30) = pJVar4;
      }
      uVar5 = (ulong)JVar3.ptr & 0xffffffff00000000;
      goto LAB_0013c547;
    }
    JS_FreeValue(ctx,JVar9);
    JS_FreeValue(ctx,JVar7);
  }
  uVar5 = 0;
  JVar9 = (JSValue)(ZEXT816(6) << 0x40);
LAB_0013c547:
  if ((0xfffffff4 < uVar6) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar8);
  }
  JVar7.tag = JVar9.tag;
  JVar7.u.ptr = (void *)(uVar5 | (ulong)JVar9.u.ptr & 0xffffffff);
  return JVar7;
}

Assistant:

static JSValue JS_GetIterator(JSContext *ctx, JSValueConst obj, BOOL is_async)
{
    JSValue method, ret, sync_iter;

    if (is_async) {
        method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_asyncIterator);
        if (JS_IsException(method))
            return method;
        if (JS_IsUndefined(method) || JS_IsNull(method)) {
            method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_iterator);
            if (JS_IsException(method))
                return method;
            sync_iter = JS_GetIterator2(ctx, obj, method);
            JS_FreeValue(ctx, method);
            if (JS_IsException(sync_iter))
                return sync_iter;
            ret = JS_CreateAsyncFromSyncIterator(ctx, sync_iter);
            JS_FreeValue(ctx, sync_iter);
            return ret;
        }
    } else {
        method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_iterator);
        if (JS_IsException(method))
            return method;
    }
    if (!JS_IsFunction(ctx, method)) {
        JS_FreeValue(ctx, method);
        return JS_ThrowTypeError(ctx, "value is not iterable");
    }
    ret = JS_GetIterator2(ctx, obj, method);
    JS_FreeValue(ctx, method);
    return ret;
}